

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::IsValid(ON_OBSOLETE_V5_DimOrdinate *this,ON_TextLog *text_log)

{
  bool bVar1;
  char *format;
  
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_type == dtDimOrdinate) {
    bVar1 = ON_OBSOLETE_V5_Annotation::IsValid(&this->super_ON_OBSOLETE_V5_Annotation,text_log);
    if (bVar1) {
      if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count
          == 2) {
        return true;
      }
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_OBSOLETE_V5_DimOrdinate - m_points.Count() = %d (should be 2).\n");
        return false;
      }
    }
    else if (text_log != (ON_TextLog *)0x0) {
      format = "ON_OBSOLETE_V5_DimOrdinate - invalid ON_OBSOLETE_V5_Annotation base class.\n";
      goto LAB_004aa0a1;
    }
  }
  else if (text_log != (ON_TextLog *)0x0) {
    format = 
    "ON_OBSOLETE_V5_DimOrdinate - m_type !=  ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate.\n"
    ;
LAB_004aa0a1:
    ON_TextLog::Print(text_log,format);
    return false;
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::IsValid( ON_TextLog* text_log) const
{
  if ( m_type != ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate)
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - m_type !=  ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate.\n");
    }
    return false;
  }

  if ( !ON_OBSOLETE_V5_Annotation::IsValid( text_log ))
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - invalid ON_OBSOLETE_V5_Annotation base class.\n");
    }
    return false;
  }

  if ( m_points.Count() != 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - m_points.Count() = %d (should be 2).\n",m_points.Count());
    }
    return false;
  }

  return true;

}